

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O0

void __thiscall
BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
          (BayesianGameForDecPOMDPStage *this,PlanningUnitDecPOMDPDiscrete *pu)

{
  allocator_type *__a;
  long *in_RSI;
  undefined8 *in_RDI;
  bool in_stack_00000097;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000098;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_000000a0;
  size_t in_stack_000000a8;
  BayesianGameIdenticalPayoff *in_stack_000000b0;
  Index in_stack_ffffffffffffff8c;
  BayesianGameForDecPOMDPStageInterface *in_stack_ffffffffffffff90;
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *this_00;
  Index in_stack_ffffffffffffffd4;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffffd8;
  
  BayesianGameForDecPOMDPStageInterface::BayesianGameForDecPOMDPStageInterface
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  this_00 = (vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)(in_RDI + 4);
  (**(code **)(*in_RSI + 0x30))();
  __a = (allocator_type *)
        PlanningUnitMADPDiscrete::GetNrActions((PlanningUnitMADPDiscrete *)0x8b5f1c);
  PlanningUnitMADPDiscrete::GetNrObservationHistoriesVector
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
             in_stack_00000097);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
  *in_RDI = &PTR__BayesianGameForDecPOMDPStage_00d06940;
  in_RDI[4] = &PTR__BayesianGameForDecPOMDPStage_00d06990;
  in_RDI[0x21] = in_RSI;
  in_RDI[0x22] = 0;
  std::allocator<JointBeliefInterface_*>::allocator((allocator<JointBeliefInterface_*> *)0x8b5fad);
  std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::vector
            (this_00,(size_type)in_RDI,__a);
  std::allocator<JointBeliefInterface_*>::~allocator((allocator<JointBeliefInterface_*> *)0x8b5fcc);
  *(undefined1 *)(in_RDI + 0x26) = 0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x8b5fe4);
  return;
}

Assistant:

BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage(
        const PlanningUnitDecPOMDPDiscrete* pu
    )
        :
    BayesianGameForDecPOMDPStageInterface(static_cast<Index>(0)),
            BayesianGameIdenticalPayoff( 
                pu->GetNrAgents(), 
                pu->GetNrActions(), 
                pu->GetNrObservationHistoriesVector(0)
            )           
            ,_m_pu(pu)
            ,_m_qHeuristic(0)
            ,_m_JBs( 0 )
            ,_m_areCachedImmediateRewards(false)
{
}